

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
updateFnArray(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
              *this,int lnForNode,int node,int currentSubtreePreL)

{
  value_type vVar1;
  reference pvVar2;
  size_type sVar3;
  int currentSubtreePreL_local;
  int node_local;
  int lnForNode_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll> *this_local;
  
  if (lnForNode < currentSubtreePreL) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->fn_);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fn_,sVar3 - 1);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fn_,(long)node);
    *pvVar2 = vVar1;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->fn_);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fn_,sVar3 - 1);
    *pvVar2 = node;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fn_,(long)lnForNode);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fn_,(long)node);
    *pvVar2 = vVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->fn_,(long)lnForNode);
    *pvVar2 = node;
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::updateFnArray(int lnForNode,
    int node, int currentSubtreePreL) {
  if (lnForNode >= currentSubtreePreL) {
    fn_[node] = fn_[lnForNode];
    fn_[lnForNode] = node;
  } else {
    fn_[node] = fn_[fn_.size() - 1];
    fn_[fn_.size() - 1] = node;
  }
}